

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O1

void Abc_GraphSolve(Gia_Man_t *pGia)

{
  uint __exponent;
  uint nLits;
  bool bVar1;
  int iVar2;
  Cnf_Dat_t *p;
  Vec_Int_t *p_00;
  int *piVar3;
  sat_solver *s;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int i;
  ulong uVar9;
  int iVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double local_68;
  ulong local_48;
  
  p = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGia,8,0,1,0,0);
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_00->pArray = piVar3;
  __exponent = pGia->vCis->nSize;
  iVar10 = p->nVars;
  s = sat_solver_new();
  sat_solver_setnvars(s,p->nVars);
  lVar11 = 0;
  while (lVar11 < p->nClauses) {
    iVar2 = sat_solver_addclause(s,p->pClauses[lVar11],p->pClauses[lVar11 + 1]);
    lVar11 = lVar11 + 1;
    if (iVar2 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilPath.c"
                    ,0x231,"void Abc_GraphSolve(Gia_Man_t *)");
    }
  }
  p_00->nSize = 0;
  if (0 < (int)__exponent) {
    iVar7 = -__exponent;
    iVar2 = iVar10 * 2 + __exponent * -2 + 1;
    do {
      if (iVar10 + iVar7 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      Vec_IntPush(p_00,iVar2);
      iVar2 = iVar2 + 2;
      iVar7 = iVar7 + 1;
    } while (iVar7 != 0);
  }
  piVar3 = p_00->pArray;
  nLits = p_00->nSize;
  uVar9 = (ulong)nLits;
  iVar10 = 0;
  uVar5 = 0;
  local_48 = 0;
  do {
    iVar2 = sat_solver_solve_lexsat(s,piVar3,nLits);
    bVar1 = true;
    if (iVar2 == 1) {
      if (0 < (int)nLits) {
        uVar4 = 0;
        do {
          if (piVar3[uVar4] < 0) goto LAB_0048e4c9;
          piVar3[uVar4] = piVar3[uVar4] ^ 1;
          uVar4 = uVar4 + 1;
        } while (uVar9 != uVar4);
      }
      iVar2 = sat_solver_addclause(s,piVar3,piVar3 + (int)nLits);
      if (iVar2 != 0) {
        if (0 < (int)nLits) {
          uVar5 = 0;
          do {
            if (piVar3[uVar5] < 0) {
LAB_0048e4c9:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            piVar3[uVar5] = piVar3[uVar5] ^ 1;
            uVar5 = uVar5 + 1;
          } while (uVar9 != uVar5);
        }
        if ((int)nLits < 1) {
          uVar5 = 0;
        }
        else {
          uVar4 = 0;
          uVar5 = 0;
          uVar6 = __exponent;
          do {
            uVar6 = uVar6 - 1;
            if (piVar3[uVar4] < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x130,"int Abc_LitIsCompl(int)");
            }
            uVar8 = 1L << ((byte)uVar6 & 0x3f);
            if ((piVar3[uVar4] & 1U) != 0) {
              uVar8 = 0;
            }
            uVar5 = uVar5 | uVar8;
            uVar4 = uVar4 + 1;
          } while (uVar9 != uVar4);
        }
        if (local_48 == 0) {
          local_48 = uVar5;
        }
        bVar1 = false;
      }
    }
    if ((bVar1) || (iVar10 = iVar10 + 1, iVar10 == 1000)) {
      local_68 = 0.0;
      uVar9 = 0;
      do {
        if ((uVar5 - local_48 >> (uVar9 & 0x3f) & 1) != 0) {
          dVar12 = exp2((double)(int)uVar9);
          local_68 = local_68 + dVar12;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != 0x40);
      uVar5 = (uVar5 - local_48) / 1000;
      uVar9 = 0;
      do {
        if ((uVar5 >> (uVar9 & 0x3f) & 1) != 0) {
          exp2((double)(int)uVar9);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != 0x40);
      printf("Vars = %d   Iters = %d   Ave = %.0f   Total = %.0f  ",local_68,(ulong)__exponent,1000)
      ;
      dVar12 = ldexp(1.0,__exponent);
      local_68 = 0.0;
      uVar9 = 0;
      do {
        if ((local_48 >> (uVar9 & 0x3f) & 1) != 0) {
          dVar13 = exp2((double)(int)uVar9);
          local_68 = local_68 + dVar13;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != 0x40);
      dVar13 = 0.0;
      uVar9 = 0;
      do {
        if ((uVar5 >> (uVar9 & 0x3f) & 1) != 0) {
          dVar14 = exp2((double)(int)uVar9);
          dVar13 = dVar13 + dVar14;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != 0x40);
      printf("Estimate = %.0f\n",(dVar12 - local_68) / dVar13);
      sat_solver_delete(s);
      Cnf_DataFree(p);
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
        p_00->pArray = (int *)0x0;
      }
      free(p_00);
      return;
    }
  } while( true );
}

Assistant:

void Abc_GraphSolve( Gia_Man_t * pGia )
{
    int nIters = 1000;
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pGia, 8, 0, 1, 0, 0 );
    sat_solver * pSat; Vec_Int_t * vLits = Vec_IntAlloc( 100 );
    int i, k, iLit, nVars = Gia_ManCiNum(pGia);
    int iCiVarBeg = pCnf->nVars - nVars;
    word Total = 0;
    word Mint1 = 0;
    word Mint2 = 0;

    // restart the SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pCnf->nVars );
    // add timeframe clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            assert( 0 );
    // create trivial assignment
    Vec_IntClear( vLits );
    for ( k = 0; k < nVars; k++ )
        Vec_IntPush( vLits, Abc_Var2Lit(iCiVarBeg+k, 1) );
    // generate random assignment
    for ( i = 0; i < nIters; i++ )
    {
        int Status = sat_solver_solve_lexsat( pSat, Vec_IntArray(vLits), Vec_IntSize(vLits) );
        if ( Status != l_True )
            break;
        assert( Status == l_True );
        // block this assignment
        Vec_IntForEachEntry( vLits, iLit, k )
            Vec_IntWriteEntry( vLits, k, Abc_LitNot(iLit) );
        if ( !sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits) ) )
            break;
        Vec_IntForEachEntry( vLits, iLit, k )
            Vec_IntWriteEntry( vLits, k, Abc_LitNot(iLit) );
        // collect new minterm
        Mint2 = 0;
        Vec_IntForEachEntry( vLits, iLit, k )
            if ( !Abc_LitIsCompl(iLit) )
                Mint2 |= ((word)1) << (nVars-1-k);
        if ( Mint1 == 0 )
            Mint1 = Mint2;
        // report
        //printf( "Iter %3d : ", i );
        //Extra_PrintBinary( stdout, (unsigned *)&Mint2, Abc_MinInt(64, nVars) ); printf( "\n" );
    }
    //Mint1 = 0;
    Total = (Mint2-Mint1)/nIters;
    printf( "Vars = %d   Iters = %d   Ave = %.0f   Total = %.0f  ", nVars, nIters, Abc_Word2Double(Mint2-Mint1), Abc_Word2Double(Total) );
    printf( "Estimate = %.0f\n", (pow(2,nVars)-Abc_Word2Double(Mint1))/Abc_Word2Double((Mint2-Mint1)/nIters) );

    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Vec_IntFree( vLits );
}